

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnCatchExpr
          (BinaryReaderInterp *this,Index tag_index)

{
  uint uVar1;
  pointer pHVar2;
  pointer pLVar3;
  pointer pLVar4;
  Result RVar5;
  Offset OVar6;
  Enum EVar7;
  Label *pLVar8;
  Location loc;
  Location loc_1;
  Var local_78;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset = loc.field_1.field_1.offset;
  Var::Var(&local_78,tag_index,&loc_1);
  RVar5 = SharedValidator::OnCatch(&this->validator_,&loc,&local_78,false);
  Var::~Var(&local_78);
  if (RVar5.enum_ == Error) {
    EVar7 = Error;
  }
  else {
    pLVar8 = TopLabel(this);
    uVar1 = pLVar8->handler_desc_index;
    pHVar2 = (this->func_->handlers).
             super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar2[uVar1].kind = Catch;
    if (pLVar8->kind == Block) {
      Istream::EmitCatchDrop(this->istream_,1);
    }
    OVar6 = pLVar8->offset;
    Istream::Emit(this->istream_,Br);
    if (OVar6 != 0xffffffff) {
      __assert_fail("offset == Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x606,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnCatchExpr(Index)"
                   );
    }
    pLVar3 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pLVar4 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    OVar6 = Istream::end(this->istream_);
    FixupMap::Append(&this->depth_fixups_,(int)((ulong)((long)pLVar3 - (long)pLVar4) >> 4) - 1,OVar6
                    );
    Istream::Emit(this->istream_,0xffffffff);
    if (pHVar2[uVar1].try_end_offset == 0xffffffff) {
      OVar6 = Istream::end(this->istream_);
      pHVar2[uVar1].try_end_offset = OVar6;
    }
    pLVar8->kind = Block;
    loc.filename._M_len = CONCAT44(loc.filename._M_len._4_4_,tag_index);
    OVar6 = Istream::end(this->istream_);
    loc.filename._M_len = CONCAT44(OVar6,(undefined4)loc.filename._M_len);
    std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
    emplace_back<wabt::interp::CatchDesc>(&pHVar2[uVar1].catches,(CatchDesc *)&loc);
    EVar7 = Ok;
  }
  return (Result)EVar7;
}

Assistant:

Result BinaryReaderInterp::OnCatchExpr(Index tag_index) {
  CHECK_RESULT(
      validator_.OnCatch(GetLocation(), Var(tag_index, GetLocation()), false));
  Label* label = TopLabel();
  HandlerDesc& desc = func_->handlers[label->handler_desc_index];
  desc.kind = HandlerKind::Catch;
  // Drop the previous block's exception if it was a catch.
  if (label->kind == LabelKind::Block) {
    istream_.EmitCatchDrop(1);
  }
  // Jump to the end of the block at the end of the previous try or catch.
  Istream::Offset offset = label->offset;
  istream_.Emit(Opcode::Br);
  assert(offset == Istream::kInvalidOffset);
  depth_fixups_.Append(label_stack_.size() - 1, istream_.end());
  istream_.Emit(offset);
  // The offset is only set after the first catch block, as the offset range
  // should only cover the try block itself.
  if (desc.try_end_offset == Istream::kInvalidOffset) {
    desc.try_end_offset = istream_.end();
  }
  // The label kind is switched to Block from Try in order to distinguish
  // catch blocks from try blocks. This is used to ensure that a try-delegate
  // inside this catch will not delegate to the catch, and instead find outer
  // try blocks to use as a delegate target.
  label->kind = LabelKind::Block;
  desc.catches.push_back(CatchDesc{tag_index, istream_.end()});
  return Result::Ok;
}